

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::on_hash_request(bt_peer_connection *this,int received)

{
  bool bVar1;
  int iVar2;
  file_index_t f;
  int32_t b;
  int32_t i;
  uint uVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  torrent_info *this_00;
  file_storage *this_01;
  char *pcVar5;
  difference_type dVar6;
  span<const_char> sVar7;
  span<libtorrent::digest32<256L>_> local_110;
  undefined1 local_100 [8];
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> hashes;
  undefined1 local_e0 [8];
  hash_request hr;
  int proof_layers;
  int count;
  int index;
  int base;
  file_index_t file_index;
  sha256_hash file_root;
  char *ptr;
  span<const_char> recv_buffer;
  file_storage *files;
  undefined1 local_58 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  error_code local_40;
  undefined1 local_29;
  error_code local_28;
  int local_14;
  bt_peer_connection *pbStack_10;
  int received_local;
  bt_peer_connection *this_local;
  
  local_14 = received;
  pbStack_10 = this;
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar2 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])();
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0x1f) & 1) == 0) {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              (&local_28,invalid_message,(type *)0x0);
    local_29 = 2;
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,&local_28,1,2);
  }
  else {
    iVar2 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
    if (iVar2 == 0x31) {
      bVar1 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
      if (bVar1) {
        peer_connection::associated_torrent((peer_connection *)&files);
        ::std::weak_ptr<libtorrent::aux::torrent>::lock
                  ((weak_ptr<libtorrent::aux::torrent> *)local_58);
        ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
                  ((weak_ptr<libtorrent::aux::torrent> *)&files);
        peVar4 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_58);
        this_00 = torrent::torrent_file(peVar4);
        this_01 = torrent_info::files(this_00);
        sVar7 = crypto_receive_buffer::get(&this->m_recv_buffer);
        recv_buffer.m_ptr = (char *)sVar7.m_len;
        ptr = sVar7.m_ptr;
        pcVar5 = span<const_char>::begin((span<const_char> *)&ptr);
        file_root.m_number._M_elems._24_8_ = pcVar5 + 1;
        digest32<256L>::digest32((digest32<256L> *)&base,(char *)file_root.m_number._M_elems._24_8_)
        ;
        f = file_storage::file_index_for_root(this_01,(digest32<256L> *)&base);
        dVar6 = digest32<256L>::size();
        file_root.m_number._M_elems._24_8_ = file_root.m_number._M_elems._24_8_ + dVar6;
        b = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
        i = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
        hr.proof_layers = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
        hr.count = read_int32<char_const*>((char **)(file_root.m_number._M_elems + 6));
        hashes.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = f;
        hash_request::hash_request((hash_request *)local_e0,f,b,i,hr.proof_layers,hr.count);
        bVar1 = peer_connection::should_log(&this->super_peer_connection,incoming_message);
        if (bVar1) {
          uVar3 = strong_typedef::operator_cast_to_int((strong_typedef *)local_e0);
          peer_connection::peer_log
                    (&this->super_peer_connection,incoming_message,"HASH_REQUEST",
                     "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)uVar3,
                     (ulong)(uint)local_e0._4_4_,hr.file.m_val,hr.base,hr.index);
        }
        bVar1 = validate_hash_request((hash_request *)local_e0,this_01);
        if (bVar1) {
          peVar4 = ::std::
                   __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_58);
          torrent::get_hashes((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                               *)local_100,peVar4,(hash_request *)local_e0);
          bVar1 = ::std::
                  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
                  empty((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         *)local_100);
          if (bVar1) {
            write_hash_reject(this,(hash_request *)local_e0,(sha256_hash *)&base);
          }
          else {
            span<libtorrent::digest32<256l>>::
            span<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::digest32<256l>,void>
                      ((span<libtorrent::digest32<256l>> *)&local_110,
                       (vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                        *)local_100);
            write_hashes(this,(hash_request *)local_e0,local_110);
          }
          hashes.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
          hashes.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = bVar1;
          ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
          ~vector((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   *)local_100);
        }
        else {
          write_hash_reject(this,(hash_request *)local_e0,(sha256_hash *)&base);
          hashes.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)local_58);
      }
    }
    else {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_40,invalid_hash_request,(type *)0x0);
      t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _7_1_ = 2;
      (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                (this,&local_40,1,2);
    }
  }
  return;
}

Assistant:

void bt_peer_connection::on_hash_request(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);

		if (!peer_info_struct()->protocol_v2)
		{
			disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_recv_buffer.packet_size() != 1 + 32 + 4 + 4 + 4 + 4)
		{
			disconnect(errors::invalid_hash_request, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}
		if (!m_recv_buffer.packet_finished()) return;

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		auto const& files = t->torrent_file().files();

		span<char const> recv_buffer = m_recv_buffer.get();
		const char* ptr = recv_buffer.begin() + 1;

		auto const file_root = sha256_hash(ptr);
		file_index_t const file_index = files.file_index_for_root(file_root);
		ptr += sha256_hash::size();
		int const base = aux::read_int32(ptr);
		int const index = aux::read_int32(ptr);
		int const count = aux::read_int32(ptr);
		int const proof_layers = aux::read_int32(ptr);
		hash_request hr(file_index, base, index, count, proof_layers);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming_message))
		{
			peer_log(peer_log_alert::incoming_message, "HASH_REQUEST"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(hr.file), hr.base, hr.index, hr.count, hr.proof_layers);
		}
#endif

		if (!validate_hash_request(hr, files))
		{
			write_hash_reject(hr, file_root);
			return;
		}

		std::vector<sha256_hash> hashes = t->get_hashes(hr);

		if (hashes.empty())
		{
			write_hash_reject(hr, file_root);
			return;
		}

		write_hashes(hr, hashes);
	}